

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  int flags_local;
  BtCursor *pCur_local;
  
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\x01') && (pCur->ix != 0)) && (pCur->apPage[pCur->iPage]->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    pCur_local._4_4_ = 0;
  }
  else {
    pCur_local._4_4_ = btreePrevious(pCur);
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}